

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

ssize_t __thiscall icu_63::VTimeZone::write(VTimeZone *this,int __fd,void *__buf,size_t __n)

{
  short sVar1;
  UBool UVar2;
  char16_t cVar3;
  int32_t iVar4;
  undefined **ppuVar5;
  UnicodeString *this_00;
  undefined **extraout_RAX;
  undefined **extraout_RAX_00;
  void *__buf_00;
  void *__buf_01;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  int iVar6;
  int __fd_00;
  undefined4 in_register_00000034;
  VTZWriter *w;
  UVector *this_01;
  ConstChar16Ptr local_e8;
  ConstChar16Ptr local_e0;
  UObject local_d8;
  UnicodeString *local_d0;
  char16_t *local_c8;
  char16_t *local_c0;
  char16_t *local_b0;
  char16_t *local_a8;
  UnicodeString utcString;
  UVector customProps;
  void *__buf_07;
  
  w = (VTZWriter *)CONCAT44(in_register_00000034,__fd);
  this_01 = this->vtzlines;
  if (this_01 == (UVector *)0x0) {
    utcString.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80;
    utcString.fUnion.fStackFields.fLengthAndFlags = 2;
    UVector::UVector(&customProps,(UObjectDeleter *)0x0,uhash_compareUnicodeString_63,
                     (UErrorCode *)__buf);
    sVar1 = (this->olsonzid).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar6 = (this->olsonzid).fUnion.fFields.fLength;
    }
    else {
      iVar6 = (int)sVar1 >> 5;
    }
    if (0 < iVar6) {
      sVar1 = (this->icutzver).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar6 = (this->icutzver).fUnion.fFields.fLength;
      }
      else {
        iVar6 = (int)sVar1 >> 5;
      }
      if (0 < iVar6) {
        icu_63::UnicodeString::append(&utcString,&this->olsonzid);
        icu_63::UnicodeString::append(&utcString,L'[');
        icu_63::UnicodeString::append(&utcString,&this->icutzver);
        icu_63::UnicodeString::append(&utcString,L']');
        UVector::addElement(&customProps,&utcString,(UErrorCode *)__buf);
      }
    }
    writeZone(this,w,this->tz,&customProps,(UErrorCode *)__buf);
    UVector::~UVector(&customProps);
    icu_63::UnicodeString::~UnicodeString(&utcString);
    ppuVar5 = extraout_RAX_00;
  }
  else {
    local_d0 = &this->tzurl;
    ppuVar5 = &PTR__UnicodeString_00471e80;
    local_d8._vptr_UObject = (_func_int **)&PTR__UnicodeString_00471e80;
    for (iVar6 = 0; iVar6 < this_01->count; iVar6 = iVar6 + 1) {
      this_00 = (UnicodeString *)UVector::elementAt(this_01,iVar6);
      local_e0.p_ = (char16_t *)ICAL_TZURL;
      UVar2 = icu_63::UnicodeString::startsWith(this_00,&local_e0,-1);
      if (UVar2 == '\0') {
        local_b0 = local_e0.p_;
LAB_00283375:
        local_e8.p_ = (char16_t *)ICAL_LASTMOD;
        UVar2 = icu_63::UnicodeString::startsWith(this_00,&local_e8,-1);
        if (UVar2 == '\0') {
          local_c8 = local_e8.p_;
          __buf_07 = extraout_RDX_00;
LAB_0028342a:
          __fd_00 = (int)this_00;
          goto LAB_00283430;
        }
        iVar4 = u_strlen_63((UChar *)ICAL_LASTMOD);
        cVar3 = icu_63::UnicodeString::doCharAt(this_00,iVar4);
        local_c0 = local_e8.p_;
        __n = (size_t)local_e8.p_;
        __buf_07 = __buf_02;
        if (cVar3 != L':') goto LAB_0028342a;
        utcString.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)(UObject)local_d8._vptr_UObject;
        utcString.fUnion.fStackFields.fLengthAndFlags = 2;
        VTZWriter::write(w,0x37ca80,__buf_02,(size_t)local_e8.p_);
        VTZWriter::write(w,0x3a,__buf_03,__n);
        getUTCDateTimeString(this->lastmod,&utcString);
        VTZWriter::write(w,(int)&utcString,__buf_04,__n);
        VTZWriter::write(w,0x37cb4e,__buf_05,__n);
        icu_63::UnicodeString::~UnicodeString(&utcString);
        ppuVar5 = extraout_RAX;
      }
      else {
        iVar4 = u_strlen_63((UChar *)ICAL_TZURL);
        cVar3 = icu_63::UnicodeString::doCharAt(this_00,iVar4);
        local_a8 = local_e0.p_;
        __n = (size_t)local_e0.p_;
        if (cVar3 != L':') goto LAB_00283375;
        VTZWriter::write(w,0x37ca6e,__buf_00,(size_t)local_e0.p_);
        VTZWriter::write(w,0x3a,__buf_01,__n);
        __fd_00 = (int)local_d0;
        __buf_07 = extraout_RDX;
LAB_00283430:
        VTZWriter::write(w,__fd_00,__buf_07,__n);
        ppuVar5 = (undefined **)VTZWriter::write(w,0x37cb4e,__buf_06,__n);
      }
      this_01 = this->vtzlines;
    }
  }
  return (ssize_t)ppuVar5;
}

Assistant:

void
VTimeZone::write(VTZWriter& writer, UErrorCode& status) const {
    if (vtzlines != NULL) {
        for (int32_t i = 0; i < vtzlines->size(); i++) {
            UnicodeString *line = (UnicodeString*)vtzlines->elementAt(i);
            if (line->startsWith(ICAL_TZURL, -1)
                && line->charAt(u_strlen(ICAL_TZURL)) == COLON) {
                writer.write(ICAL_TZURL);
                writer.write(COLON);
                writer.write(tzurl);
                writer.write(ICAL_NEWLINE);
            } else if (line->startsWith(ICAL_LASTMOD, -1)
                && line->charAt(u_strlen(ICAL_LASTMOD)) == COLON) {
                UnicodeString utcString;
                writer.write(ICAL_LASTMOD);
                writer.write(COLON);
                writer.write(getUTCDateTimeString(lastmod, utcString));
                writer.write(ICAL_NEWLINE);
            } else {
                writer.write(*line);
                writer.write(ICAL_NEWLINE);
            }
        }
    } else {
        UnicodeString icutzprop;
        UVector customProps(nullptr, uhash_compareUnicodeString, status);
        if (olsonzid.length() > 0 && icutzver.length() > 0) {
            icutzprop.append(olsonzid);
            icutzprop.append(u'[');
            icutzprop.append(icutzver);
            icutzprop.append(u']');
            customProps.addElement(&icutzprop, status);
        }
        writeZone(writer, *tz, &customProps, status);
    }
}